

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O3

int __thiscall
ncnn::LSTM::forward(LSTM *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  int iVar1;
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  pointer pMVar8;
  ulong uVar9;
  void *in_R8;
  int _h_00;
  void *__src;
  void *__dest;
  bool bVar10;
  Mat m;
  Mat local_318;
  Mat local_2c8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_280;
  Mat hidden1;
  Mat cell1;
  Mat m_1;
  Mat m_2;
  Mat m_5;
  Mat local_108;
  Mat m_7;
  Mat m_8;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  _h = bottom_blob->h;
  iVar1 = this->direction;
  local_2c8.cstep = 0;
  local_2c8.data = (void *)0x0;
  local_2c8.refcount._0_4_ = 0;
  local_2c8.refcount._4_4_ = 0;
  local_2c8.elemsize._0_4_ = 0;
  local_2c8.elemsize._4_4_ = 0;
  local_2c8.elempack = 0;
  local_2c8.allocator = (Allocator *)0x0;
  local_2c8.dims = 0;
  local_2c8.w = 0;
  local_2c8.h = 0;
  local_2c8.d = 0;
  local_2c8.c = 0;
  local_318.cstep = 0;
  local_318.data = (void *)0x0;
  local_318.refcount._0_4_ = 0;
  local_318.refcount._4_4_ = 0;
  local_318.elemsize._0_4_ = 0;
  local_318.elemsize._4_4_ = 0;
  local_318.elempack = 0;
  local_318.allocator = (Allocator *)0x0;
  local_318.dims = 0;
  local_318.w = 0;
  local_318.h = 0;
  local_318.d = 0;
  local_318.c = 0;
  _allocator = (&opt->blob_allocator)
               [(long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start != 0xd8];
  local_280 = top_blobs;
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0xd8) {
    Mat::clone(&m,(__fn *)(bottom_blob + 1),_allocator,0xd8,in_R8);
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_2c8.allocator == (Allocator *)0x0) {
          if (local_2c8.data != (void *)0x0) {
            free(local_2c8.data);
          }
        }
        else {
          (*(local_2c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_2c8.data = m.data;
    local_2c8.refcount._0_4_ = m.refcount._0_4_;
    local_2c8.refcount._4_4_ = m.refcount._4_4_;
    local_2c8.elemsize._0_4_ = (undefined4)m.elemsize;
    local_2c8.elemsize._4_4_ = m.elemsize._4_4_;
    local_2c8.elempack = m.elempack;
    local_2c8.allocator = m.allocator;
    local_2c8.dims = m.dims;
    local_2c8.w = m.w;
    local_2c8.h = m.h;
    uVar3._0_4_ = m.d;
    uVar3._4_4_ = m.c;
    local_2c8.d = m.d;
    local_2c8.c = m.c;
    local_2c8.cstep = m.cstep;
    sVar7 = m.cstep;
    uVar4 = uVar3;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      uVar4 = local_2c8._52_8_;
      if (*piVar2 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            local_2c8._52_8_ = uVar3;
            free(m.data);
            uVar4 = local_2c8._52_8_;
          }
        }
        else {
          local_2c8._52_8_ = uVar3;
          (*(m.allocator)->_vptr_Allocator[3])();
          uVar4 = local_2c8._52_8_;
        }
      }
    }
    local_2c8._52_8_ = uVar4;
    Mat::clone(&m,(__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 2),_allocator,(int)sVar7,
               in_R8);
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_318.allocator == (Allocator *)0x0) {
          if (local_318.data != (void *)0x0) {
            free(local_318.data);
          }
        }
        else {
          (*(local_318.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_318.data = m.data;
    local_318.refcount._0_4_ = m.refcount._0_4_;
    local_318.refcount._4_4_ = m.refcount._4_4_;
    local_318.elemsize._0_4_ = (undefined4)m.elemsize;
    local_318.elemsize._4_4_ = m.elemsize._4_4_;
    local_318.elempack = m.elempack;
    local_318.allocator = m.allocator;
    local_318.dims = m.dims;
    local_318.w = m.w;
    local_318.h = m.h;
    local_318.d = m.d;
    local_318.c = m.c;
    local_318.cstep = m.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    _h_00 = (iVar1 == 2) + 1;
    Mat::create(&local_2c8,this->num_output,_h_00,4,_allocator);
    iVar6 = -100;
    if ((local_2c8.data == (void *)0x0) || (local_2c8.cstep * (long)local_2c8.c == 0))
    goto LAB_002180d0;
    uVar5 = (int)local_2c8.cstep * local_2c8.c;
    if (0 < (int)uVar5) {
      memset(local_2c8.data,0,(ulong)uVar5 << 2);
    }
    Mat::create(&local_318,this->num_output,_h_00,4,_allocator);
    if ((local_318.data == (void *)0x0) || (local_318.cstep * (long)local_318.c == 0))
    goto LAB_002180d0;
    uVar5 = (int)local_318.cstep * local_318.c;
    if (0 < (int)uVar5) {
      memset(local_318.data,0,(ulong)uVar5 << 2);
    }
  }
  this_00 = (local_280->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->num_output << (iVar1 == 2),_h,4,opt->blob_allocator);
  iVar6 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    uVar5 = this->direction;
    if (uVar5 < 2) {
      bVar10 = (this->weight_xc_data).dims == 3;
      m.w = (this->weight_xc_data).w;
      m.h = (this->weight_xc_data).h;
      m.c = 1;
      if (!bVar10) {
        m.c = (this->weight_xc_data).d;
      }
      m.dims = bVar10 ^ 3;
      m.data = (this->weight_xc_data).data;
      sVar7 = (this->weight_xc_data).elemsize;
      m.elempack = (this->weight_xc_data).elempack;
      m.allocator = (this->weight_xc_data).allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)sVar7;
      m.elemsize._4_4_ = (undefined4)(sVar7 >> 0x20);
      m.cstep = (long)m.h * (long)m.w;
      m.d = 1;
      bVar10 = (this->bias_c_data).dims == 3;
      m_1.w = (this->bias_c_data).w;
      m_1.h = (this->bias_c_data).h;
      m_1.c = 1;
      if (!bVar10) {
        m_1.c = (this->bias_c_data).d;
      }
      m_1.dims = bVar10 ^ 3;
      m_1.data = (this->bias_c_data).data;
      sVar7 = (this->bias_c_data).elemsize;
      m_1.elempack = (this->bias_c_data).elempack;
      m_1.allocator = (this->bias_c_data).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)sVar7;
      m_1.elemsize._4_4_ = (undefined4)(sVar7 >> 0x20);
      m_1.cstep = (long)m_1.h * (long)m_1.w;
      m_1.d = 1;
      bVar10 = (this->weight_hc_data).dims == 3;
      m_2.w = (this->weight_hc_data).w;
      m_2.h = (this->weight_hc_data).h;
      m_2.c = 1;
      if (!bVar10) {
        m_2.c = (this->weight_hc_data).d;
      }
      m_2.dims = bVar10 ^ 3;
      m_2.data = (this->weight_hc_data).data;
      m_2.elemsize = (this->weight_hc_data).elemsize;
      m_2.elempack = (this->weight_hc_data).elempack;
      m_2.allocator = (this->weight_hc_data).allocator;
      m_2.refcount = (int *)0x0;
      m_2.cstep = (long)m_2.h * (long)m_2.w;
      m_2.d = 1;
      iVar6 = lstm(bottom_blob,this_00,uVar5,&m,&m_1,&m_2,&local_2c8,&local_318,
                   (Option *)opt->workspace_allocator);
      piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (iVar6 != 0) goto LAB_002180d0;
      uVar5 = this->direction;
    }
    if (uVar5 == 2) {
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.allocator = (Allocator *)0x0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      Mat::create(&m,this->num_output,_h,4,opt->workspace_allocator);
      iVar6 = -100;
      if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
        bVar10 = false;
      }
      else {
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.allocator = (Allocator *)0x0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
        Mat::create(&m_1,this->num_output,_h,4,opt->workspace_allocator);
        iVar6 = -100;
        if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
          bVar10 = false;
        }
        else {
          m_2.cstep = (size_t)local_2c8.w;
          m_2.elemsize = CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize);
          m_2.data = local_2c8.data;
          m_2.refcount = (int *)0x0;
          m_2.elempack = local_2c8.elempack;
          m_2.allocator = local_2c8.allocator;
          m_2.dims = 2;
          m_2.w = local_2c8.w;
          m_2.h = 1;
          m_2.d = 1;
          m_2.c = 1;
          local_108.cstep = (size_t)local_318.w;
          local_108.elemsize = CONCAT44(local_318.elemsize._4_4_,(undefined4)local_318.elemsize);
          local_108.data = local_318.data;
          local_108.refcount = (int *)0x0;
          local_108.elempack = local_318.elempack;
          local_108.allocator = local_318.allocator;
          local_108.dims = 2;
          local_108.w = local_318.w;
          local_108.h = 1;
          local_108.d = 1;
          local_108.c = 1;
          bVar10 = (this->weight_xc_data).dims == 3;
          hidden1.w = (this->weight_xc_data).w;
          hidden1.h = (this->weight_xc_data).h;
          hidden1.c = 1;
          if (!bVar10) {
            hidden1.c = (this->weight_xc_data).d;
          }
          hidden1.dims = bVar10 ^ 3;
          hidden1.data = (this->weight_xc_data).data;
          hidden1.elemsize = (this->weight_xc_data).elemsize;
          hidden1.elempack = (this->weight_xc_data).elempack;
          hidden1.allocator = (this->weight_xc_data).allocator;
          hidden1.refcount = (int *)0x0;
          hidden1.cstep = (long)hidden1.h * (long)hidden1.w;
          hidden1.d = 1;
          bVar10 = (this->bias_c_data).dims == 3;
          cell1.w = (this->bias_c_data).w;
          cell1.h = (this->bias_c_data).h;
          cell1.c = 1;
          if (!bVar10) {
            cell1.c = (this->bias_c_data).d;
          }
          cell1.dims = bVar10 ^ 3;
          cell1.data = (this->bias_c_data).data;
          cell1.elemsize = (this->bias_c_data).elemsize;
          cell1.elempack = (this->bias_c_data).elempack;
          cell1.allocator = (this->bias_c_data).allocator;
          cell1.refcount = (int *)0x0;
          cell1.cstep = (long)cell1.h * (long)cell1.w;
          cell1.d = 1;
          bVar10 = (this->weight_hc_data).dims == 3;
          m_5.w = (this->weight_hc_data).w;
          m_5.h = (this->weight_hc_data).h;
          m_5.c = 1;
          if (!bVar10) {
            m_5.c = (this->weight_hc_data).d;
          }
          m_5.dims = bVar10 ^ 3;
          m_5.data = (this->weight_hc_data).data;
          m_5.elemsize = (this->weight_hc_data).elemsize;
          m_5.elempack = (this->weight_hc_data).elempack;
          m_5.allocator = (this->weight_hc_data).allocator;
          m_5.refcount = (int *)0x0;
          m_5.cstep = (long)m_5.h * (long)m_5.w;
          m_5.d = 1;
          iVar6 = lstm(bottom_blob,&m,0,&hidden1,&cell1,&m_5,&m_2,&local_108,
                       (Option *)opt->workspace_allocator);
          if (hidden1.refcount != (int *)0x0) {
            LOCK();
            *hidden1.refcount = *hidden1.refcount + -1;
            UNLOCK();
            if (*hidden1.refcount == 0) {
              if (hidden1.allocator == (Allocator *)0x0) {
                if (hidden1.data != (void *)0x0) {
                  free(hidden1.data);
                }
              }
              else {
                (*(hidden1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (iVar6 == 0) {
            hidden1.cstep = (size_t)local_2c8.w;
            hidden1.elemsize = CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize);
            hidden1.data = (void *)(hidden1.elemsize * hidden1.cstep + (long)local_2c8.data);
            hidden1.refcount = (int *)0x0;
            hidden1.elempack = local_2c8.elempack;
            hidden1.allocator = local_2c8.allocator;
            hidden1.dims = 2;
            hidden1.w = local_2c8.w;
            hidden1.h = 1;
            hidden1.d = 1;
            hidden1.c = 1;
            cell1.cstep = (size_t)local_318.w;
            cell1.elemsize = CONCAT44(local_318.elemsize._4_4_,(undefined4)local_318.elemsize);
            cell1.data = (void *)(cell1.elemsize * cell1.cstep + (long)local_318.data);
            cell1.refcount = (int *)0x0;
            cell1.elempack = local_318.elempack;
            cell1.allocator = local_318.allocator;
            cell1.dims = 2;
            cell1.w = local_318.w;
            cell1.h = 1;
            cell1.d = 1;
            cell1.c = 1;
            bVar10 = (this->weight_xc_data).dims == 3;
            m_5.w = (this->weight_xc_data).w;
            m_5.h = (this->weight_xc_data).h;
            m_5.c = 1;
            if (!bVar10) {
              m_5.c = (this->weight_xc_data).d;
            }
            m_5.dims = bVar10 ^ 3;
            m_5.elemsize = (this->weight_xc_data).elemsize;
            m_5.data = (void *)((this->weight_xc_data).cstep * m_5.elemsize +
                               (long)(this->weight_xc_data).data);
            m_5.elempack = (this->weight_xc_data).elempack;
            m_5.allocator = (this->weight_xc_data).allocator;
            m_5.refcount = (int *)0x0;
            m_5.cstep = (long)m_5.h * (long)m_5.w;
            m_5.d = 1;
            bVar10 = (this->bias_c_data).dims == 3;
            m_7.w = (this->bias_c_data).w;
            m_7.h = (this->bias_c_data).h;
            m_7.c = 1;
            if (!bVar10) {
              m_7.c = (this->bias_c_data).d;
            }
            m_7.dims = bVar10 ^ 3;
            m_7.elemsize = (this->bias_c_data).elemsize;
            m_7.data = (void *)((this->bias_c_data).cstep * m_7.elemsize +
                               (long)(this->bias_c_data).data);
            m_7.elempack = (this->bias_c_data).elempack;
            m_7.allocator = (this->bias_c_data).allocator;
            m_7.refcount = (int *)0x0;
            m_7.cstep = (long)m_7.h * (long)m_7.w;
            m_7.d = 1;
            bVar10 = (this->weight_hc_data).dims == 3;
            m_8.w = (this->weight_hc_data).w;
            m_8.h = (this->weight_hc_data).h;
            m_8.c = 1;
            if (!bVar10) {
              m_8.c = (this->weight_hc_data).d;
            }
            m_8.dims = bVar10 ^ 3;
            m_8.elemsize = (this->weight_hc_data).elemsize;
            m_8.data = (void *)((this->weight_hc_data).cstep * m_8.elemsize +
                               (long)(this->weight_hc_data).data);
            m_8.elempack = (this->weight_hc_data).elempack;
            m_8.allocator = (this->weight_hc_data).allocator;
            m_8.refcount = (int *)0x0;
            m_8.cstep = (long)m_8.h * (long)m_8.w;
            m_8.d = 1;
            iVar6 = lstm(bottom_blob,&m_1,1,&m_5,&m_7,&m_8,&hidden1,&cell1,
                         (Option *)opt->workspace_allocator);
            Mat::~Mat(&m_8);
            Mat::~Mat(&m_7);
            Mat::~Mat(&m_5);
            bVar10 = iVar6 == 0;
            if (bVar10) {
              if ((int)_h < 1) {
                iVar6 = 0;
              }
              else {
                iVar6 = 0;
                uVar9 = 0;
                do {
                  __src = (void *)((long)m_1.w * uVar9 *
                                   CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                  (long)m_1.data);
                  __dest = (void *)((long)this_00->w * uVar9 * this_00->elemsize +
                                   (long)this_00->data);
                  memcpy(__dest,(void *)((long)m.w * uVar9 *
                                         CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                        (long)m.data),(long)this->num_output << 2);
                  memcpy((void *)((long)this->num_output * 4 + (long)__dest),__src,
                         (long)this->num_output << 2);
                  uVar9 = uVar9 + 1;
                } while (_h != uVar9);
              }
            }
            Mat::~Mat(&cell1);
            Mat::~Mat(&hidden1);
          }
          else {
            bVar10 = false;
          }
          if (local_108.refcount != (int *)0x0) {
            LOCK();
            *local_108.refcount = *local_108.refcount + -1;
            UNLOCK();
            if (*local_108.refcount == 0) {
              if (local_108.allocator == (Allocator *)0x0) {
                if (local_108.data != (void *)0x0) {
                  free(local_108.data);
                }
              }
              else {
                (*(local_108.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (m_2.refcount != (int *)0x0) {
            LOCK();
            *m_2.refcount = *m_2.refcount + -1;
            UNLOCK();
            if (*m_2.refcount == 0) {
              if (m_2.allocator == (Allocator *)0x0) {
                if (m_2.data != (void *)0x0) {
                  free(m_2.data);
                }
              }
              else {
                (*(m_2.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar10) goto LAB_002180d0;
    }
    pMVar8 = (local_280->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar6 = 0;
    if ((long)(local_280->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar8 == 0xd8) {
      if (pMVar8 + 1 != &local_2c8) {
        piVar2 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = pMVar8[1].refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (pMVar8[1].allocator == (Allocator *)0x0) {
              if (pMVar8[1].data != (void *)0x0) {
                free(pMVar8[1].data);
              }
            }
            else {
              (*(pMVar8[1].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar8[1].data = local_2c8.data;
        pMVar8[1].refcount = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
        pMVar8[1].elemsize = CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize);
        pMVar8[1].elempack = local_2c8.elempack;
        pMVar8[1].allocator = local_2c8.allocator;
        pMVar8[1].dims = local_2c8.dims;
        pMVar8[1].w = local_2c8.w;
        pMVar8[1].h = local_2c8.h;
        pMVar8[1].d = local_2c8.d;
        pMVar8[1].c = local_2c8.c;
        pMVar8[1].cstep = local_2c8.cstep;
        pMVar8 = (local_280->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      iVar6 = 0;
      if (pMVar8 + 2 != &local_318) {
        piVar2 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = pMVar8[2].refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (pMVar8[2].allocator == (Allocator *)0x0) {
              if (pMVar8[2].data != (void *)0x0) {
                free(pMVar8[2].data);
              }
            }
            else {
              (*(pMVar8[2].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar8[2].data = local_318.data;
        pMVar8[2].refcount = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
        pMVar8[2].elemsize = CONCAT44(local_318.elemsize._4_4_,(undefined4)local_318.elemsize);
        pMVar8[2].elempack = local_318.elempack;
        pMVar8[2].allocator = local_318.allocator;
        pMVar8[2].dims = local_318.dims;
        pMVar8[2].w = local_318.w;
        pMVar8[2].h = local_318.h;
        pMVar8[2].d = local_318.d;
        pMVar8[2].c = local_318.c;
        pMVar8[2].cstep = local_318.cstep;
      }
    }
  }
LAB_002180d0:
  piVar2 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_318.allocator == (Allocator *)0x0) {
        if (local_318.data != (void *)0x0) {
          free(local_318.data);
        }
      }
      else {
        (*(local_318.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar2 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_2c8.allocator == (Allocator *)0x0) {
        if (local_2c8.data != (void *)0x0) {
          free(local_2c8.data);
        }
      }
      else {
        (*(local_2c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar6;
}

Assistant:

int LSTM::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden0, cell0, opt);
        if (ret0 != 0)
            return ret0;

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden1, cell1, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}